

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Expr * sqlite3ExprAddCollateString(Parse *pParse,Expr *pExpr,char *zC)

{
  uint uVar1;
  Expr *pEVar2;
  long in_FS_OFFSET;
  undefined1 local_30 [16];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_30._0_8_ = zC;
  uVar1 = sqlite3Strlen30(zC);
  local_30._8_4_ = uVar1;
  pEVar2 = sqlite3ExprAddCollateToken(pParse,pExpr,(Token *)local_30,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return pEVar2;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprAddCollateString(
  const Parse *pParse,  /* Parsing context */
  Expr *pExpr,          /* Add the "COLLATE" clause to this expression */
  const char *zC        /* The collating sequence name */
){
  Token s;
  assert( zC!=0 );
  sqlite3TokenInit(&s, (char*)zC);
  return sqlite3ExprAddCollateToken(pParse, pExpr, &s, 0);
}